

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O0

time_t parse_time(char *p,size_t n)

{
  uint64_t uVar1;
  int64_t data;
  time_t t;
  tm tm;
  size_t n_local;
  char *p_local;
  
  tm.tm_zone = (char *)n;
  memset(&t,0,0x38);
  if (tm.tm_zone == (char *)0x14) {
    uVar1 = atol10(p,4);
    if ((long)uVar1 < 0x76c) {
      p_local = (char *)0x0;
    }
    else {
      tm.tm_mday = (int)uVar1 + -0x76c;
      if (p[4] == '-') {
        uVar1 = atol10(p + 5,2);
        if (((long)uVar1 < 1) || (0xc < (long)uVar1)) {
          p_local = (char *)0x0;
        }
        else {
          tm.tm_hour = (int)uVar1 + -1;
          if (p[7] == '-') {
            uVar1 = atol10(p + 8,2);
            if (((long)uVar1 < 1) || (0x1f < (long)uVar1)) {
              p_local = (char *)0x0;
            }
            else {
              tm.tm_min = (int)uVar1;
              if (p[10] == 'T') {
                uVar1 = atol10(p + 0xb,2);
                if (((long)uVar1 < 0) || (0x17 < (long)uVar1)) {
                  p_local = (char *)0x0;
                }
                else {
                  tm.tm_sec = (int)uVar1;
                  if (p[0xd] == ':') {
                    uVar1 = atol10(p + 0xe,2);
                    if (((long)uVar1 < 0) || (0x3b < (long)uVar1)) {
                      p_local = (char *)0x0;
                    }
                    else {
                      t._4_4_ = (undefined4)uVar1;
                      if (p[0x10] == ':') {
                        uVar1 = atol10(p + 0x11,2);
                        if (((long)uVar1 < 0) || (0x3c < (long)uVar1)) {
                          p_local = (char *)0x0;
                        }
                        else {
                          t._0_4_ = (undefined4)uVar1;
                          p_local = (char *)time_from_tm((tm *)&t);
                        }
                      }
                      else {
                        p_local = (char *)0x0;
                      }
                    }
                  }
                  else {
                    p_local = (char *)0x0;
                  }
                }
              }
              else {
                p_local = (char *)0x0;
              }
            }
          }
          else {
            p_local = (char *)0x0;
          }
        }
      }
      else {
        p_local = (char *)0x0;
      }
    }
  }
  else {
    p_local = (char *)0x0;
  }
  return (time_t)p_local;
}

Assistant:

static time_t
parse_time(const char *p, size_t n)
{
	struct tm tm;
	time_t t = 0;
	int64_t data;

	memset(&tm, 0, sizeof(tm));
	if (n != 20)
		return (t);
	data = atol10(p, 4);
	if (data < 1900)
		return (t);
	tm.tm_year = (int)data - 1900;
	p += 4;
	if (*p++ != '-')
		return (t);
	data = atol10(p, 2);
	if (data < 1 || data > 12)
		return (t);
	tm.tm_mon = (int)data -1;
	p += 2;
	if (*p++ != '-')
		return (t);
	data = atol10(p, 2);
	if (data < 1 || data > 31)
		return (t);
	tm.tm_mday = (int)data;
	p += 2;
	if (*p++ != 'T')
		return (t);
	data = atol10(p, 2);
	if (data < 0 || data > 23)
		return (t);
	tm.tm_hour = (int)data;
	p += 2;
	if (*p++ != ':')
		return (t);
	data = atol10(p, 2);
	if (data < 0 || data > 59)
		return (t);
	tm.tm_min = (int)data;
	p += 2;
	if (*p++ != ':')
		return (t);
	data = atol10(p, 2);
	if (data < 0 || data > 60)
		return (t);
	tm.tm_sec = (int)data;
#if 0
	p += 2;
	if (*p != 'Z')
		return (t);
#endif

	t = time_from_tm(&tm);

	return (t);
}